

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(EpsCopyOutputStream *this,uint8 *ptr)

{
  LogMessage *pLVar1;
  uint8 *puVar2;
  int iVar3;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  
  do {
    if (this->had_error_ == true) {
      return this->buffer_;
    }
    iVar3 = (int)ptr - (int)this->end_;
    if (iVar3 < 0) {
      internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
                 ,0x33d);
      pLVar1 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: overrun >= 0: ");
      internal::LogFinisher::operator=(&local_31,pLVar1);
      internal::LogMessage::~LogMessage(&local_a8);
    }
    if (0x10 < iVar3) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
                 ,0x33e);
      pLVar1 = internal::LogMessage::operator<<(&local_70,"CHECK failed: overrun <= kSlopBytes: ");
      internal::LogFinisher::operator=(&local_31,pLVar1);
      internal::LogMessage::~LogMessage(&local_70);
    }
    puVar2 = Next(this);
    ptr = puVar2 + iVar3;
  } while (this->end_ <= ptr);
  return ptr;
}

Assistant:

uint8* EpsCopyOutputStream::EnsureSpaceFallback(uint8* ptr) {
  do {
    if (PROTOBUF_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    GOOGLE_DCHECK(overrun >= 0);           // NOLINT
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  GOOGLE_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}